

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::BeginFrameObserverState::BeginFrameObserverState
          (BeginFrameObserverState *this)

{
  BeginFrameObserverState *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__BeginFrameObserverState_009c1c00;
  this->dropped_begin_frame_args_ = 0;
  protozero::CopyablePtr<perfetto::protos::gen::BeginFrameArgs>::CopyablePtr
            (&this->last_begin_frame_args_);
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<3UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

BeginFrameObserverState::BeginFrameObserverState() = default;